

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

int __thiscall
JsUtil::
BaseDictionary<char16_t_const*,DynamicProfileStorage::StorageInfo,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
::FindEntryWithKey<char16_t_const*>
          (BaseDictionary<char16_t_const*,DynamicProfileStorage::StorageInfo,Memory::NoCheckHeapAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::DictionaryEntry,JsUtil::NoResizeLock>
           *this,char16_t **key)

{
  long lVar1;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  hash_t hVar5;
  int iVar6;
  char16_t *pcVar7;
  undefined4 *puVar8;
  char16_t cVar9;
  ushort *puVar10;
  ushort uVar11;
  uint uVar12;
  uint depth;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  DictionaryStats *this_00;
  
  lVar2 = *(long *)this;
  depth = 0;
  if (lVar2 != 0) {
    pcVar7 = *key;
    cVar9 = *pcVar7;
    if (cVar9 == L'\0') {
      uVar12 = 0x2393b8b;
    }
    else {
      uVar12 = 0x811c9dc5;
      do {
        pcVar7 = pcVar7 + 1;
        uVar13 = (ushort)cVar9 ^ uVar12;
        uVar12 = uVar13 * 0x1000193;
        cVar9 = *pcVar7;
      } while (cVar9 != L'\0');
      uVar12 = uVar13 * 0x2000326 + 1;
    }
    hVar5 = PrimePolicy::ModPrime(uVar12 >> 1,*(uint *)(this + 0x1c),*(int *)(this + 0x2c));
    uVar13 = *(uint *)(lVar2 + (ulong)hVar5 * 4);
    depth = 0;
    if (-1 < (int)uVar13) {
      lVar2 = *(long *)(this + 8);
      depth = 0;
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      do {
        puVar10 = *(ushort **)(lVar2 + 0x18 + (ulong)uVar13 * 0x28);
        uVar11 = *puVar10;
        if (uVar11 == 0) {
          uVar14 = 0x2393b8b;
        }
        else {
          uVar14 = 0x811c9dc5;
          do {
            puVar10 = puVar10 + 1;
            uVar15 = uVar11 ^ uVar14;
            uVar14 = uVar15 * 0x1000193;
            uVar11 = *puVar10;
          } while (uVar11 != 0);
          uVar14 = uVar15 * 0x2000326 + 1;
        }
        lVar1 = lVar2 + (ulong)uVar13 * 0x28;
        if (uVar14 != *(uint *)(lVar1 + 0x20)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DictionaryEntry.h"
                             ,199,
                             "(((static_cast<hash_t>(Comparer::GetHashCode(this->Key())) << 1) | 1) == this->hashCode)"
                             ,"TAGHASH(Comparer::GetHashCode(this->Key())) == this->hashCode");
          if (!bVar4) {
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar8 = 0;
          uVar14 = *(uint *)(lVar1 + 0x20);
        }
        if (uVar14 == uVar12) {
          iVar6 = PAL_wcscmp(*(char16_t **)(lVar1 + 0x18),*key);
          if (iVar6 == 0) {
            this_00 = *(DictionaryStats **)(this + 0x30);
            goto LAB_0096eeb7;
          }
        }
        depth = depth + 1;
        uVar13 = *(uint *)(lVar1 + 0x10);
      } while (-1 < (int)uVar13);
    }
  }
  this_00 = *(DictionaryStats **)(this + 0x30);
  uVar13 = 0xffffffff;
LAB_0096eeb7:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,depth);
  }
  return uVar13;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key) const
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return i;
                    }

#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }

#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return -1;
        }